

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::minmax_test::test(minmax_test *this)

{
  allocator<char> local_2a49;
  string local_2a48;
  string local_2a28;
  allocator<char> local_2a01;
  string local_2a00;
  string local_29e0;
  allocator<char> local_29b9;
  string local_29b8;
  string local_2998;
  allocator<char> local_2971;
  string local_2970;
  string local_2950;
  allocator<char> local_2929;
  string local_2928;
  string local_2908;
  allocator<char> local_28e1;
  string local_28e0;
  string local_28c0;
  allocator<char> local_2899;
  string local_2898;
  string local_2878;
  allocator<char> local_2851;
  string local_2850;
  string local_2830;
  allocator<char> local_2809;
  string local_2808;
  string local_27e8;
  allocator<char> local_27c1;
  string local_27c0;
  string local_27a0;
  allocator<char> local_2779;
  string local_2778;
  string local_2758;
  allocator<char> local_2731;
  string local_2730;
  string local_2710;
  allocator<char> local_26e9;
  string local_26e8;
  string local_26c8;
  allocator<char> local_26a1;
  string local_26a0;
  string local_2680;
  allocator<char> local_2659;
  string local_2658;
  string local_2638;
  allocator<char> local_2611;
  string local_2610;
  string local_25f0;
  allocator<char> local_25c9;
  string local_25c8;
  string local_25a8;
  allocator<char> local_2581;
  string local_2580;
  string local_2560;
  allocator<char> local_2539;
  string local_2538;
  string local_2518;
  allocator<char> local_24f1;
  string local_24f0;
  string local_24d0;
  allocator<char> local_24a9;
  string local_24a8;
  string local_2488;
  allocator<char> local_2461;
  string local_2460;
  string local_2440;
  allocator<char> local_2419;
  string local_2418;
  string local_23f8;
  allocator<char> local_23d1;
  string local_23d0;
  string local_23b0;
  allocator<char> local_2389;
  string local_2388;
  string local_2368;
  allocator<char> local_2341;
  string local_2340;
  string local_2320;
  allocator<char> local_22f9;
  string local_22f8;
  string local_22d8;
  allocator<char> local_22b1;
  string local_22b0;
  string local_2290;
  allocator<char> local_2269;
  string local_2268;
  string local_2248;
  allocator<char> local_2221;
  string local_2220;
  string local_2200;
  allocator<char> local_21d9;
  string local_21d8;
  string local_21b8;
  allocator<char> local_2191;
  string local_2190;
  string local_2170;
  allocator<char> local_2149;
  string local_2148;
  string local_2128;
  allocator<char> local_2101;
  string local_2100;
  string local_20e0;
  allocator<char> local_20b9;
  string local_20b8;
  string local_2098;
  allocator<char> local_2071;
  string local_2070;
  string local_2050;
  allocator<char> local_2029;
  string local_2028;
  string local_2008;
  allocator<char> local_1fe1;
  string local_1fe0;
  string local_1fc0;
  allocator<char> local_1f99;
  string local_1f98;
  string local_1f78;
  allocator<char> local_1f51;
  string local_1f50;
  string local_1f30;
  allocator<char> local_1f09;
  string local_1f08;
  string local_1ee8;
  allocator<char> local_1ec1;
  string local_1ec0;
  string local_1ea0;
  allocator<char> local_1e79;
  string local_1e78;
  string local_1e58;
  allocator<char> local_1e31;
  string local_1e30;
  string local_1e10;
  allocator<char> local_1de9;
  string local_1de8;
  string local_1dc8;
  allocator<char> local_1da1;
  string local_1da0;
  string local_1d80;
  allocator<char> local_1d59;
  string local_1d58;
  string local_1d38;
  allocator<char> local_1d11;
  string local_1d10;
  string local_1cf0;
  allocator<char> local_1cc9;
  string local_1cc8;
  string local_1ca8;
  allocator<char> local_1c81;
  string local_1c80;
  string local_1c60;
  allocator<char> local_1c39;
  string local_1c38;
  string local_1c18;
  allocator<char> local_1bf1;
  string local_1bf0;
  string local_1bd0;
  allocator<char> local_1ba9;
  string local_1ba8;
  string local_1b88;
  allocator<char> local_1b61;
  string local_1b60;
  string local_1b40;
  allocator<char> local_1b19;
  string local_1b18;
  string local_1af8;
  allocator<char> local_1ad1;
  string local_1ad0;
  string local_1ab0;
  allocator<char> local_1a89;
  string local_1a88;
  string local_1a68;
  allocator<char> local_1a41;
  string local_1a40;
  string local_1a20;
  allocator<char> local_19f9;
  string local_19f8;
  string local_19d8;
  allocator<char> local_19b1;
  string local_19b0;
  string local_1990;
  allocator<char> local_1969;
  string local_1968;
  string local_1948;
  allocator<char> local_1921;
  string local_1920;
  string local_1900;
  allocator<char> local_18d9;
  string local_18d8;
  string local_18b8;
  allocator<char> local_1891;
  string local_1890;
  string local_1870;
  allocator<char> local_1849;
  string local_1848;
  string local_1828;
  allocator<char> local_1801;
  string local_1800;
  string local_17e0;
  allocator<char> local_17b9;
  string local_17b8;
  string local_1798;
  allocator<char> local_1771;
  string local_1770;
  string local_1750;
  allocator<char> local_1729;
  string local_1728;
  string local_1708;
  allocator<char> local_16e1;
  string local_16e0;
  string local_16c0;
  allocator<char> local_1699;
  string local_1698;
  string local_1678;
  allocator<char> local_1651;
  string local_1650;
  string local_1630;
  allocator<char> local_1609;
  string local_1608;
  string local_15e8;
  allocator<char> local_15c1;
  string local_15c0;
  string local_15a0;
  allocator<char> local_1579;
  string local_1578;
  string local_1558;
  allocator<char> local_1531;
  string local_1530;
  string local_1510;
  allocator<char> local_14e9;
  string local_14e8;
  string local_14c8;
  allocator<char> local_14a1;
  string local_14a0;
  string local_1480;
  allocator<char> local_1459;
  string local_1458;
  string local_1438;
  allocator<char> local_1411;
  string local_1410;
  string local_13f0;
  allocator<char> local_13c9;
  string local_13c8;
  string local_13a8;
  allocator<char> local_1381;
  string local_1380;
  string local_1360;
  allocator<char> local_1339;
  string local_1338;
  string local_1318;
  allocator<char> local_12f1;
  string local_12f0;
  string local_12d0;
  allocator<char> local_12a9;
  string local_12a8;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  string local_1240;
  allocator<char> local_1219;
  string local_1218;
  string local_11f8;
  allocator<char> local_11d1;
  string local_11d0;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  string local_1168;
  allocator<char> local_1141;
  string local_1140;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  string local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  string local_1000;
  allocator<char> local_fd9;
  string local_fd8;
  string local_fb8;
  allocator<char> local_f91;
  string local_f90;
  string local_f70;
  allocator<char> local_f49;
  string local_f48;
  string local_f28;
  allocator<char> local_f01;
  string local_f00;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  string local_e50;
  allocator<char> local_e29;
  string local_e28;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  string local_dc0;
  allocator<char> local_d99;
  string local_d98;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  string local_d30;
  allocator<char> local_d09;
  string local_d08;
  string local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  string local_c58;
  allocator<char> local_c31;
  string local_c30;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  string local_b38;
  allocator<char> local_b11;
  string local_b10;
  string local_af0;
  allocator<char> local_ac9;
  string local_ac8;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  string local_988;
  allocator<char> local_961;
  string local_960;
  string local_940;
  allocator<char> local_919;
  string local_918;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  minmax_test *local_10;
  minmax_test *this_local;
  
  local_10 = this;
  compile_fixture::build_libs(&this->super_compile_fixture);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"(max 1)",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"(min 2)",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"(max 1.5)",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"(min 2.2)",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2.2",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(max 1.0 2.0)",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("7.2",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"(max 1 2.0)",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"(max 1.0 2)",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"(max 1 2)",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"(max 1 2 7 -3 -11 6 3)",&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(min 1.0 2.0)",&local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"(min 1 2.0)",&local_3c1);
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"(min 1.0 2)",&local_409);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"(min 1 2)",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeaa,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"(min 1 2 7 -3 -11 6 3)",&local_499);
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_498,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeab,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"(arithmetic-shift 1 10)",&local_4e1);
  compile_fixture::run(&local_4c0,&this->super_compile_fixture,&local_4e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1024",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeac,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"(arithmetic-shift 255 -3)",&local_529);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_528,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("31",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xead,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"(quotient 10 3)",&local_571);
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_570,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeaf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"(quotient -10 3)",&local_5b9);
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_5b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"(quotient 10.0 3)",&local_601);
  compile_fixture::run(&local_5e0,&this->super_compile_fixture,&local_600,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"(quotient -10.0 3)",&local_649);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_648,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"(quotient 10.0 3.0)",&local_691);
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_690,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"(quotient -10.0 3.0)",&local_6d9);
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_6d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"(quotient 10 3.0)",&local_721);
  compile_fixture::run(&local_700,&this->super_compile_fixture,&local_720,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"(quotient -10 3.0)",&local_769);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_768,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"(remainder 10 3)",&local_7b1);
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_7b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"(remainder -10 3)",&local_7f9);
  compile_fixture::run(&local_7d8,&this->super_compile_fixture,&local_7f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"(remainder 10.0 3)",&local_841);
  compile_fixture::run(&local_820,&this->super_compile_fixture,&local_840,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeba,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"(remainder -10.0 3)",&local_889);
  compile_fixture::run(&local_868,&this->super_compile_fixture,&local_888,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,"(remainder 10.0 3.0)",&local_8d1);
  compile_fixture::run(&local_8b0,&this->super_compile_fixture,&local_8d0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_8b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"(remainder -10.0 3.0)",&local_919);
  compile_fixture::run(&local_8f8,&this->super_compile_fixture,&local_918,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_8f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"(remainder 10 3.0)",&local_961);
  compile_fixture::run(&local_940,&this->super_compile_fixture,&local_960,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_940,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebe,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,"(remainder -10 3.0)",&local_9a9);
  compile_fixture::run(&local_988,&this->super_compile_fixture,&local_9a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_988,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,
             "(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_9f1);
  compile_fixture::run(&local_9d0,&this->super_compile_fixture,&local_9f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_9d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,
             "(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_a39);
  compile_fixture::run(&local_a18,&this->super_compile_fixture,&local_a38,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_a18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"(let ([a 1324] [b -324.0]) (quotient a b ))",&local_a81);
  compile_fixture::run(&local_a60,&this->super_compile_fixture,&local_a80,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_a60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ac8,"(let ([a 1324] [b -324.0]) (remainder a b ))",&local_ac9);
  compile_fixture::run(&local_aa8,&this->super_compile_fixture,&local_ac8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("28",&local_aa8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator(&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,
             "(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))",&local_b11);
  compile_fixture::run(&local_af0,&this->super_compile_fixture,&local_b10,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1324",&local_af0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"(modulo 10 3)",&local_b59);
  compile_fixture::run(&local_b38,&this->super_compile_fixture,&local_b58,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_b38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba0,"(modulo -10 3)",&local_ba1);
  compile_fixture::run(&local_b80,&this->super_compile_fixture,&local_ba0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_b80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_b80);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be8,"(modulo 10.0 3)",&local_be9);
  compile_fixture::run(&local_bc8,&this->super_compile_fixture,&local_be8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_bc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeca,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::allocator<char>::~allocator(&local_be9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c30,"(modulo -10.0 -3)",&local_c31);
  compile_fixture::run(&local_c10,&this->super_compile_fixture,&local_c30,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_c10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string((string *)&local_c30);
  std::allocator<char>::~allocator(&local_c31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c78,"(modulo 10.0 3.0)",&local_c79);
  compile_fixture::run(&local_c58,&this->super_compile_fixture,&local_c78,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_c58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_c58);
  std::__cxx11::string::~string((string *)&local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cc0,"(modulo -10.0 3.0)",&local_cc1);
  compile_fixture::run(&local_ca0,&this->super_compile_fixture,&local_cc0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_ca0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d08,"(modulo 10 -3.0)",&local_d09);
  compile_fixture::run(&local_ce8,&this->super_compile_fixture,&local_d08,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_ce8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xece,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator(&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d50,"(modulo -10 3.0)",&local_d51);
  compile_fixture::run(&local_d30,&this->super_compile_fixture,&local_d50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_d30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d98,"(abs 3)",&local_d99);
  compile_fixture::run(&local_d78,&this->super_compile_fixture,&local_d98,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_d78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::string::~string((string *)&local_d98);
  std::allocator<char>::~allocator(&local_d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_de0,"(abs 3.2)",&local_de1);
  compile_fixture::run(&local_dc0,&this->super_compile_fixture,&local_de0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_dc0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_dc0);
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator(&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e28,"(abs -3)",&local_e29);
  compile_fixture::run(&local_e08,&this->super_compile_fixture,&local_e28,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_e08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::~string((string *)&local_e28);
  std::allocator<char>::~allocator(&local_e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e70,"(abs -3.2)",&local_e71);
  compile_fixture::run(&local_e50,&this->super_compile_fixture,&local_e70,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_e50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_e70);
  std::allocator<char>::~allocator(&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_eb8,"(abs 0)",&local_eb9);
  compile_fixture::run(&local_e98,&this->super_compile_fixture,&local_eb8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_e98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_e98);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f00,"(abs 0.0)",&local_f01);
  compile_fixture::run(&local_ee0,&this->super_compile_fixture,&local_f00,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_ee0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator(&local_f01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f48,"(flonum->fixnum 3.143)",&local_f49);
  compile_fixture::run(&local_f28,&this->super_compile_fixture,&local_f48,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_f28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_f28);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator(&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f90,"(flonum->fixnum -3.143)",&local_f91);
  compile_fixture::run(&local_f70,&this->super_compile_fixture,&local_f90,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_f70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_f90);
  std::allocator<char>::~allocator(&local_f91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fd8,"(fixnum->flonum 3)",&local_fd9);
  compile_fixture::run(&local_fb8,&this->super_compile_fixture,&local_fd8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_fb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_fb8);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator(&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,"(flonum? (fixnum->flonum 3))",&local_1021);
  compile_fixture::run(&local_1000,&this->super_compile_fixture,&local_1020,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1000,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1000);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1068,"(max 1)",&local_1069);
  compile_fixture::run_optimized(&local_1048,&this->super_compile_fixture,&local_1068,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1048,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xede,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10b0,"(min 2)",&local_10b1);
  compile_fixture::run_optimized(&local_1090,&this->super_compile_fixture,&local_10b0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1090,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1090);
  std::__cxx11::string::~string((string *)&local_10b0);
  std::allocator<char>::~allocator(&local_10b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10f8,"(max 1.5)",&local_10f9);
  compile_fixture::run_optimized(&local_10d8,&this->super_compile_fixture,&local_10f8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_10d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::~string((string *)&local_10f8);
  std::allocator<char>::~allocator(&local_10f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1140,"(min 2.2)",&local_1141);
  compile_fixture::run_optimized(&local_1120,&this->super_compile_fixture,&local_1140,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2.2",&local_1120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1120);
  std::__cxx11::string::~string((string *)&local_1140);
  std::allocator<char>::~allocator(&local_1141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1188,"(max 1.0 2.0)",&local_1189);
  compile_fixture::run_optimized(&local_1168,&this->super_compile_fixture,&local_1188,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11d0,"(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_11d1);
  compile_fixture::run_optimized(&local_11b0,&this->super_compile_fixture,&local_11d0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("7.2",&local_11b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_11b0);
  std::__cxx11::string::~string((string *)&local_11d0);
  std::allocator<char>::~allocator(&local_11d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1218,"(max 1 2.0)",&local_1219);
  compile_fixture::run_optimized(&local_11f8,&this->super_compile_fixture,&local_1218,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_11f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_11f8);
  std::__cxx11::string::~string((string *)&local_1218);
  std::allocator<char>::~allocator(&local_1219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1260,"(max 1.0 2)",&local_1261);
  compile_fixture::run_optimized(&local_1240,&this->super_compile_fixture,&local_1260,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1240,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1240);
  std::__cxx11::string::~string((string *)&local_1260);
  std::allocator<char>::~allocator(&local_1261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12a8,"(max 1 2)",&local_12a9);
  compile_fixture::run_optimized(&local_1288,&this->super_compile_fixture,&local_12a8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1288);
  std::__cxx11::string::~string((string *)&local_12a8);
  std::allocator<char>::~allocator(&local_12a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12f0,"(max 1 2 7 -3 -11 6 3)",&local_12f1);
  compile_fixture::run_optimized(&local_12d0,&this->super_compile_fixture,&local_12f0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_12d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_12d0);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator(&local_12f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1338,"(min 1.0 2.0)",&local_1339);
  compile_fixture::run_optimized(&local_1318,&this->super_compile_fixture,&local_1338,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1318,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1318);
  std::__cxx11::string::~string((string *)&local_1338);
  std::allocator<char>::~allocator(&local_1339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1380,"(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)",&local_1381);
  compile_fixture::run_optimized(&local_1360,&this->super_compile_fixture,&local_1380,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_1360,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeea,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1360);
  std::__cxx11::string::~string((string *)&local_1380);
  std::allocator<char>::~allocator(&local_1381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13c8,"(min 1 2.0)",&local_13c9);
  compile_fixture::run_optimized(&local_13a8,&this->super_compile_fixture,&local_13c8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_13a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeeb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_13a8);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::allocator<char>::~allocator(&local_13c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1410,"(min 1.0 2)",&local_1411);
  compile_fixture::run_optimized(&local_13f0,&this->super_compile_fixture,&local_1410,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_13f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeec,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_13f0);
  std::__cxx11::string::~string((string *)&local_1410);
  std::allocator<char>::~allocator(&local_1411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1458,"(min 1 2)",&local_1459);
  compile_fixture::run_optimized(&local_1438,&this->super_compile_fixture,&local_1458,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1438,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeed,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1438);
  std::__cxx11::string::~string((string *)&local_1458);
  std::allocator<char>::~allocator(&local_1459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14a0,"(min 1 2 7 -3 -11 6 3)",&local_14a1);
  compile_fixture::run_optimized(&local_1480,&this->super_compile_fixture,&local_14a0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_1480,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeee,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1480);
  std::__cxx11::string::~string((string *)&local_14a0);
  std::allocator<char>::~allocator(&local_14a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14e8,"(arithmetic-shift 1 10)",&local_14e9);
  compile_fixture::run_optimized(&local_14c8,&this->super_compile_fixture,&local_14e8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1024",&local_14c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeef,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::~string((string *)&local_14e8);
  std::allocator<char>::~allocator(&local_14e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1530,"(arithmetic-shift 255 -3)",&local_1531);
  compile_fixture::run_optimized(&local_1510,&this->super_compile_fixture,&local_1530,6);
  TestEq<char_const*,std::__cxx11::string>
            ("31",&local_1510,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1510);
  std::__cxx11::string::~string((string *)&local_1530);
  std::allocator<char>::~allocator(&local_1531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1578,"(quotient 10 3)",&local_1579);
  compile_fixture::run_optimized(&local_1558,&this->super_compile_fixture,&local_1578,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1558,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1558);
  std::__cxx11::string::~string((string *)&local_1578);
  std::allocator<char>::~allocator(&local_1579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15c0,"(quotient -10 3)",&local_15c1);
  compile_fixture::run_optimized(&local_15a0,&this->super_compile_fixture,&local_15c0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_15a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_15a0);
  std::__cxx11::string::~string((string *)&local_15c0);
  std::allocator<char>::~allocator(&local_15c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1608,"(quotient 10.0 3)",&local_1609);
  compile_fixture::run_optimized(&local_15e8,&this->super_compile_fixture,&local_1608,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_15e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_15e8);
  std::__cxx11::string::~string((string *)&local_1608);
  std::allocator<char>::~allocator(&local_1609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1650,"(quotient -10.0 3)",&local_1651);
  compile_fixture::run_optimized(&local_1630,&this->super_compile_fixture,&local_1650,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1630,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1630);
  std::__cxx11::string::~string((string *)&local_1650);
  std::allocator<char>::~allocator(&local_1651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1698,"(quotient 10.0 3.0)",&local_1699);
  compile_fixture::run_optimized(&local_1678,&this->super_compile_fixture,&local_1698,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1678,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1678);
  std::__cxx11::string::~string((string *)&local_1698);
  std::allocator<char>::~allocator(&local_1699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16e0,"(quotient -10.0 3.0)",&local_16e1);
  compile_fixture::run_optimized(&local_16c0,&this->super_compile_fixture,&local_16e0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_16c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_16c0);
  std::__cxx11::string::~string((string *)&local_16e0);
  std::allocator<char>::~allocator(&local_16e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1728,"(quotient 10 3.0)",&local_1729);
  compile_fixture::run_optimized(&local_1708,&this->super_compile_fixture,&local_1728,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1708,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1708);
  std::__cxx11::string::~string((string *)&local_1728);
  std::allocator<char>::~allocator(&local_1729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1770,"(quotient -10 3.0)",&local_1771);
  compile_fixture::run_optimized(&local_1750,&this->super_compile_fixture,&local_1770,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1750,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1750);
  std::__cxx11::string::~string((string *)&local_1770);
  std::allocator<char>::~allocator(&local_1771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17b8,"(remainder 10 3)",&local_17b9);
  compile_fixture::run_optimized(&local_1798,&this->super_compile_fixture,&local_17b8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1798,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1798);
  std::__cxx11::string::~string((string *)&local_17b8);
  std::allocator<char>::~allocator(&local_17b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1800,"(remainder -10 3)",&local_1801);
  compile_fixture::run_optimized(&local_17e0,&this->super_compile_fixture,&local_1800,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_17e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_17e0);
  std::__cxx11::string::~string((string *)&local_1800);
  std::allocator<char>::~allocator(&local_1801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1848,"(remainder 10.0 3)",&local_1849);
  compile_fixture::run_optimized(&local_1828,&this->super_compile_fixture,&local_1848,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1828,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1828);
  std::__cxx11::string::~string((string *)&local_1848);
  std::allocator<char>::~allocator(&local_1849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1890,"(remainder -10.0 3)",&local_1891);
  compile_fixture::run_optimized(&local_1870,&this->super_compile_fixture,&local_1890,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_1870,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefe,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1870);
  std::__cxx11::string::~string((string *)&local_1890);
  std::allocator<char>::~allocator(&local_1891);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18d8,"(remainder 10.0 3.0)",&local_18d9);
  compile_fixture::run_optimized(&local_18b8,&this->super_compile_fixture,&local_18d8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_18b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeff,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_18b8);
  std::__cxx11::string::~string((string *)&local_18d8);
  std::allocator<char>::~allocator(&local_18d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1920,"(remainder -10.0 3.0)",&local_1921);
  compile_fixture::run_optimized(&local_1900,&this->super_compile_fixture,&local_1920,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_1900,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf00,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1900);
  std::__cxx11::string::~string((string *)&local_1920);
  std::allocator<char>::~allocator(&local_1921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1968,"(remainder 10 3.0)",&local_1969);
  compile_fixture::run_optimized(&local_1948,&this->super_compile_fixture,&local_1968,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1948,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf01,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1948);
  std::__cxx11::string::~string((string *)&local_1968);
  std::allocator<char>::~allocator(&local_1969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19b0,"(remainder -10 3.0)",&local_19b1);
  compile_fixture::run_optimized(&local_1990,&this->super_compile_fixture,&local_19b0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_1990,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf02,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1990);
  std::__cxx11::string::~string((string *)&local_19b0);
  std::allocator<char>::~allocator(&local_19b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19f8,
             "(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_19f9);
  compile_fixture::run_optimized(&local_19d8,&this->super_compile_fixture,&local_19f8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_19d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf04,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_19d8);
  std::__cxx11::string::~string((string *)&local_19f8);
  std::allocator<char>::~allocator(&local_19f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a40,
             "(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )",
             &local_1a41);
  compile_fixture::run_optimized(&local_1a20,&this->super_compile_fixture,&local_1a40,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1a20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf05,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1a20);
  std::__cxx11::string::~string((string *)&local_1a40);
  std::allocator<char>::~allocator(&local_1a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a88,"(let ([a 1324] [b -324.0]) (quotient a b ))",&local_1a89);
  compile_fixture::run_optimized(&local_1a68,&this->super_compile_fixture,&local_1a88,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_1a68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf06,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1a68);
  std::__cxx11::string::~string((string *)&local_1a88);
  std::allocator<char>::~allocator(&local_1a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ad0,"(let ([a 1324] [b -324.0]) (remainder a b ))",&local_1ad1);
  compile_fixture::run_optimized(&local_1ab0,&this->super_compile_fixture,&local_1ad0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("28",&local_1ab0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf07,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1ab0);
  std::__cxx11::string::~string((string *)&local_1ad0);
  std::allocator<char>::~allocator(&local_1ad1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b18,
             "(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))",&local_1b19);
  compile_fixture::run_optimized(&local_1af8,&this->super_compile_fixture,&local_1b18,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1324",&local_1af8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf08,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1af8);
  std::__cxx11::string::~string((string *)&local_1b18);
  std::allocator<char>::~allocator(&local_1b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b60,"(modulo 10 3)",&local_1b61);
  compile_fixture::run_optimized(&local_1b40,&this->super_compile_fixture,&local_1b60,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1b40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1b40);
  std::__cxx11::string::~string((string *)&local_1b60);
  std::allocator<char>::~allocator(&local_1b61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ba8,"(modulo -10 3)",&local_1ba9);
  compile_fixture::run_optimized(&local_1b88,&this->super_compile_fixture,&local_1ba8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1b88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1b88);
  std::__cxx11::string::~string((string *)&local_1ba8);
  std::allocator<char>::~allocator(&local_1ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1bf0,"(modulo 10.0 3)",&local_1bf1);
  compile_fixture::run_optimized(&local_1bd0,&this->super_compile_fixture,&local_1bf0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1bd0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1bd0);
  std::__cxx11::string::~string((string *)&local_1bf0);
  std::allocator<char>::~allocator(&local_1bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c38,"(modulo -10.0 -3)",&local_1c39);
  compile_fixture::run_optimized(&local_1c18,&this->super_compile_fixture,&local_1c38,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_1c18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1c18);
  std::__cxx11::string::~string((string *)&local_1c38);
  std::allocator<char>::~allocator(&local_1c39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c80,"(modulo 10.0 3.0)",&local_1c81);
  compile_fixture::run_optimized(&local_1c60,&this->super_compile_fixture,&local_1c80,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1c60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1c60);
  std::__cxx11::string::~string((string *)&local_1c80);
  std::allocator<char>::~allocator(&local_1c81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1cc8,"(modulo -10.0 3.0)",&local_1cc9);
  compile_fixture::run_optimized(&local_1ca8,&this->super_compile_fixture,&local_1cc8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1ca8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1ca8);
  std::__cxx11::string::~string((string *)&local_1cc8);
  std::allocator<char>::~allocator(&local_1cc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d10,"(modulo 10 -3.0)",&local_1d11);
  compile_fixture::run_optimized(&local_1cf0,&this->super_compile_fixture,&local_1d10,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_1cf0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf10,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1cf0);
  std::__cxx11::string::~string((string *)&local_1d10);
  std::allocator<char>::~allocator(&local_1d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d58,"(modulo -10 3.0)",&local_1d59);
  compile_fixture::run_optimized(&local_1d38,&this->super_compile_fixture,&local_1d58,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1d38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf11,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1d38);
  std::__cxx11::string::~string((string *)&local_1d58);
  std::allocator<char>::~allocator(&local_1d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1da0,"(abs 3)",&local_1da1);
  compile_fixture::run_optimized(&local_1d80,&this->super_compile_fixture,&local_1da0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1d80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf13,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1d80);
  std::__cxx11::string::~string((string *)&local_1da0);
  std::allocator<char>::~allocator(&local_1da1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1de8,"(abs 3.2)",&local_1de9);
  compile_fixture::run_optimized(&local_1dc8,&this->super_compile_fixture,&local_1de8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_1dc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf14,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1dc8);
  std::__cxx11::string::~string((string *)&local_1de8);
  std::allocator<char>::~allocator(&local_1de9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e30,"(abs -3)",&local_1e31);
  compile_fixture::run_optimized(&local_1e10,&this->super_compile_fixture,&local_1e30,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1e10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf15,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1e10);
  std::__cxx11::string::~string((string *)&local_1e30);
  std::allocator<char>::~allocator(&local_1e31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e78,"(abs -3.2)",&local_1e79)
  ;
  compile_fixture::run_optimized(&local_1e58,&this->super_compile_fixture,&local_1e78,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_1e58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf16,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1e58);
  std::__cxx11::string::~string((string *)&local_1e78);
  std::allocator<char>::~allocator(&local_1e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ec0,"(abs 0)",&local_1ec1);
  compile_fixture::run_optimized(&local_1ea0,&this->super_compile_fixture,&local_1ec0,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_1ea0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf17,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1ea0);
  std::__cxx11::string::~string((string *)&local_1ec0);
  std::allocator<char>::~allocator(&local_1ec1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f08,"(abs 0.0)",&local_1f09);
  compile_fixture::run_optimized(&local_1ee8,&this->super_compile_fixture,&local_1f08,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_1ee8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf18,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1ee8);
  std::__cxx11::string::~string((string *)&local_1f08);
  std::allocator<char>::~allocator(&local_1f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f50,"(inexact->exact 3.14)",&local_1f51);
  compile_fixture::run(&local_1f30,&this->super_compile_fixture,&local_1f50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1f30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1f30);
  std::__cxx11::string::~string((string *)&local_1f50);
  std::allocator<char>::~allocator(&local_1f51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f98,"(inexact->exact 3)",&local_1f99);
  compile_fixture::run(&local_1f78,&this->super_compile_fixture,&local_1f98,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1f78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1f78);
  std::__cxx11::string::~string((string *)&local_1f98);
  std::allocator<char>::~allocator(&local_1f99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fe0,"(exact->inexact 3.14)",&local_1fe1);
  compile_fixture::run(&local_1fc0,&this->super_compile_fixture,&local_1fe0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3.14",&local_1fc0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_1fc0);
  std::__cxx11::string::~string((string *)&local_1fe0);
  std::allocator<char>::~allocator(&local_1fe1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2028,"(exact->inexact 3)",&local_2029);
  compile_fixture::run(&local_2008,&this->super_compile_fixture,&local_2028,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2008,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2008);
  std::__cxx11::string::~string((string *)&local_2028);
  std::allocator<char>::~allocator(&local_2029);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2070,"(flonum? (exact->inexact 3))",&local_2071);
  compile_fixture::run(&local_2050,&this->super_compile_fixture,&local_2070,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2050,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2050);
  std::__cxx11::string::~string((string *)&local_2070);
  std::allocator<char>::~allocator(&local_2071);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20b8,"(inexact? (exact->inexact 3))",&local_20b9);
  compile_fixture::run(&local_2098,&this->super_compile_fixture,&local_20b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2098,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf20,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2098);
  std::__cxx11::string::~string((string *)&local_20b8);
  std::allocator<char>::~allocator(&local_20b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2100,"(finite? 3.14)",&local_2101);
  compile_fixture::run(&local_20e0,&this->super_compile_fixture,&local_2100,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_20e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf22,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_20e0);
  std::__cxx11::string::~string((string *)&local_2100);
  std::allocator<char>::~allocator(&local_2101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2148,"(finite? 2)",&local_2149);
  compile_fixture::run(&local_2128,&this->super_compile_fixture,&local_2148,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf23,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2128);
  std::__cxx11::string::~string((string *)&local_2148);
  std::allocator<char>::~allocator(&local_2149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2190,"(finite? (/ 1.0 0.0))",&local_2191);
  compile_fixture::run(&local_2170,&this->super_compile_fixture,&local_2190,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2170,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf24,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2170);
  std::__cxx11::string::~string((string *)&local_2190);
  std::allocator<char>::~allocator(&local_2191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21d8,"(finite? (/ 0.0 0.0))",&local_21d9);
  compile_fixture::run(&local_21b8,&this->super_compile_fixture,&local_21d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_21b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf25,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_21b8);
  std::__cxx11::string::~string((string *)&local_21d8);
  std::allocator<char>::~allocator(&local_21d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2220,"(nan? 3.14)",&local_2221);
  compile_fixture::run(&local_2200,&this->super_compile_fixture,&local_2220,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2200,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf27,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2200);
  std::__cxx11::string::~string((string *)&local_2220);
  std::allocator<char>::~allocator(&local_2221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2268,"(nan? 2)",&local_2269);
  compile_fixture::run(&local_2248,&this->super_compile_fixture,&local_2268,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf28,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2248);
  std::__cxx11::string::~string((string *)&local_2268);
  std::allocator<char>::~allocator(&local_2269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_22b0,"(nan? (/ 1.0 0.0))",&local_22b1);
  compile_fixture::run(&local_2290,&this->super_compile_fixture,&local_22b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2290,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf29,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2290);
  std::__cxx11::string::~string((string *)&local_22b0);
  std::allocator<char>::~allocator(&local_22b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_22f8,"(nan? (/ 0.0 0.0))",&local_22f9);
  compile_fixture::run(&local_22d8,&this->super_compile_fixture,&local_22f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_22d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_22d8);
  std::__cxx11::string::~string((string *)&local_22f8);
  std::allocator<char>::~allocator(&local_22f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2340,"(inf? 3.14)",&local_2341);
  compile_fixture::run(&local_2320,&this->super_compile_fixture,&local_2340,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2320,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2320);
  std::__cxx11::string::~string((string *)&local_2340);
  std::allocator<char>::~allocator(&local_2341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2388,"(inf? 2)",&local_2389);
  compile_fixture::run(&local_2368,&this->super_compile_fixture,&local_2388,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2368);
  std::__cxx11::string::~string((string *)&local_2388);
  std::allocator<char>::~allocator(&local_2389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23d0,"(inf? (/ 1.0 0.0))",&local_23d1);
  compile_fixture::run(&local_23b0,&this->super_compile_fixture,&local_23d0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_23b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_23b0);
  std::__cxx11::string::~string((string *)&local_23d0);
  std::allocator<char>::~allocator(&local_23d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2418,"(inf? (/ 0.0 0.0))",&local_2419);
  compile_fixture::run(&local_23f8,&this->super_compile_fixture,&local_2418,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_23f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2418);
  std::allocator<char>::~allocator(&local_2419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2460,"(/ 0.0 0.0)",&local_2461);
  compile_fixture::run(&local_2440,&this->super_compile_fixture,&local_2460,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-nan",&local_2440,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf34,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2440);
  std::__cxx11::string::~string((string *)&local_2460);
  std::allocator<char>::~allocator(&local_2461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24a8,"(integer? 3)",&local_24a9);
  compile_fixture::run(&local_2488,&this->super_compile_fixture,&local_24a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf39,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2488);
  std::__cxx11::string::~string((string *)&local_24a8);
  std::allocator<char>::~allocator(&local_24a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24f0,"(integer? 3.2)",&local_24f1);
  compile_fixture::run(&local_24d0,&this->super_compile_fixture,&local_24f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_24d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_24d0);
  std::__cxx11::string::~string((string *)&local_24f0);
  std::allocator<char>::~allocator(&local_24f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2538,"(integer? 3.0)",&local_2539);
  compile_fixture::run(&local_2518,&this->super_compile_fixture,&local_2538,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2518,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2518);
  std::__cxx11::string::~string((string *)&local_2538);
  std::allocator<char>::~allocator(&local_2539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2580,"(ceiling 3)",&local_2581);
  compile_fixture::run(&local_2560,&this->super_compile_fixture,&local_2580,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2560,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2560);
  std::__cxx11::string::~string((string *)&local_2580);
  std::allocator<char>::~allocator(&local_2581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25c8,"(ceiling 3.0)",&local_25c9);
  compile_fixture::run(&local_25a8,&this->super_compile_fixture,&local_25c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_25a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_25a8);
  std::__cxx11::string::~string((string *)&local_25c8);
  std::allocator<char>::~allocator(&local_25c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2610,"(ceiling 3.0000000001)",&local_2611);
  compile_fixture::run(&local_25f0,&this->super_compile_fixture,&local_2610,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("4",&local_25f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_25f0);
  std::__cxx11::string::~string((string *)&local_2610);
  std::allocator<char>::~allocator(&local_2611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2658,"(ceiling 2.9)",&local_2659);
  compile_fixture::run(&local_2638,&this->super_compile_fixture,&local_2658,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2638,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf40,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2638);
  std::__cxx11::string::~string((string *)&local_2658);
  std::allocator<char>::~allocator(&local_2659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26a0,"(ceiling -3)",&local_26a1);
  compile_fixture::run(&local_2680,&this->super_compile_fixture,&local_26a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_2680,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf41,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2680);
  std::__cxx11::string::~string((string *)&local_26a0);
  std::allocator<char>::~allocator(&local_26a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26e8,"(ceiling -3.1)",&local_26e9);
  compile_fixture::run(&local_26c8,&this->super_compile_fixture,&local_26e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_26c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf42,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_26c8);
  std::__cxx11::string::~string((string *)&local_26e8);
  std::allocator<char>::~allocator(&local_26e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2730,"(ceiling -2.9)",&local_2731);
  compile_fixture::run(&local_2710,&this->super_compile_fixture,&local_2730,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_2710,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf43,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2710);
  std::__cxx11::string::~string((string *)&local_2730);
  std::allocator<char>::~allocator(&local_2731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2778,"(ceiling -2.5)",&local_2779);
  compile_fixture::run(&local_2758,&this->super_compile_fixture,&local_2778,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_2758,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf44,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2758);
  std::__cxx11::string::~string((string *)&local_2778);
  std::allocator<char>::~allocator(&local_2779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27c0,"(ceiling -2.1)",&local_27c1);
  compile_fixture::run(&local_27a0,&this->super_compile_fixture,&local_27c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_27a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf45,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_27a0);
  std::__cxx11::string::~string((string *)&local_27c0);
  std::allocator<char>::~allocator(&local_27c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2808,"(floor 3)",&local_2809);
  compile_fixture::run(&local_27e8,&this->super_compile_fixture,&local_2808,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_27e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf47,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_27e8);
  std::__cxx11::string::~string((string *)&local_2808);
  std::allocator<char>::~allocator(&local_2809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2850,"(floor 3.0)",&local_2851);
  compile_fixture::run(&local_2830,&this->super_compile_fixture,&local_2850,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2830,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf48,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2830);
  std::__cxx11::string::~string((string *)&local_2850);
  std::allocator<char>::~allocator(&local_2851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2898,"(floor 3.0000000001)",&local_2899);
  compile_fixture::run(&local_2878,&this->super_compile_fixture,&local_2898,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2878,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf49,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2878);
  std::__cxx11::string::~string((string *)&local_2898);
  std::allocator<char>::~allocator(&local_2899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28e0,"(floor 2.9)",&local_28e1);
  compile_fixture::run(&local_28c0,&this->super_compile_fixture,&local_28e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_28c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_28c0);
  std::__cxx11::string::~string((string *)&local_28e0);
  std::allocator<char>::~allocator(&local_28e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2928,"(floor -3)",&local_2929)
  ;
  compile_fixture::run(&local_2908,&this->super_compile_fixture,&local_2928,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_2908,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2908);
  std::__cxx11::string::~string((string *)&local_2928);
  std::allocator<char>::~allocator(&local_2929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2970,"(floor -3.1)",&local_2971);
  compile_fixture::run(&local_2950,&this->super_compile_fixture,&local_2970,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_2950,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2950);
  std::__cxx11::string::~string((string *)&local_2970);
  std::allocator<char>::~allocator(&local_2971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_29b8,"(floor -2.9)",&local_29b9);
  compile_fixture::run(&local_2998,&this->super_compile_fixture,&local_29b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_2998,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2998);
  std::__cxx11::string::~string((string *)&local_29b8);
  std::allocator<char>::~allocator(&local_29b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a00,"(floor -2.5)",&local_2a01);
  compile_fixture::run(&local_29e0,&this->super_compile_fixture,&local_2a00,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_29e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_29e0);
  std::__cxx11::string::~string((string *)&local_2a00);
  std::allocator<char>::~allocator(&local_2a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a48,"(floor -2.1)",&local_2a49);
  compile_fixture::run(&local_2a28,&this->super_compile_fixture,&local_2a48,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_2a28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  std::__cxx11::string::~string((string *)&local_2a28);
  std::__cxx11::string::~string((string *)&local_2a48);
  std::allocator<char>::~allocator(&local_2a49);
  return;
}

Assistant:

void test()
      {
      build_libs();

      TEST_EQ("1", run("(max 1)"));
      TEST_EQ("2", run("(min 2)"));
      TEST_EQ("1.5", run("(max 1.5)"));
      TEST_EQ("2.2", run("(min 2.2)"));
      TEST_EQ("2", run("(max 1.0 2.0)"));
      TEST_EQ("7.2", run("(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("2", run("(max 1 2.0)"));
      TEST_EQ("2", run("(max 1.0 2)"));
      TEST_EQ("2", run("(max 1 2)"));
      TEST_EQ("7", run("(max 1 2 7 -3 -11 6 3)"));

      TEST_EQ("1", run("(min 1.0 2.0)"));
      TEST_EQ("-11", run("(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("1", run("(min 1 2.0)"));
      TEST_EQ("1", run("(min 1.0 2)"));
      TEST_EQ("1", run("(min 1 2)"));
      TEST_EQ("-11", run("(min 1 2 7 -3 -11 6 3)"));
      TEST_EQ("1024", run("(arithmetic-shift 1 10)"));
      TEST_EQ("31", run("(arithmetic-shift 255 -3)"));

      TEST_EQ("3", run("(quotient 10 3)"));
      TEST_EQ("-3", run("(quotient -10 3)"));
      TEST_EQ("3", run("(quotient 10.0 3)"));
      TEST_EQ("-3", run("(quotient -10.0 3)"));
      TEST_EQ("3", run("(quotient 10.0 3.0)"));
      TEST_EQ("-3", run("(quotient -10.0 3.0)"));
      TEST_EQ("3", run("(quotient 10 3.0)"));
      TEST_EQ("-3", run("(quotient -10 3.0)"));

      TEST_EQ("1", run("(remainder 10 3)"));
      TEST_EQ("-1", run("(remainder -10 3)"));
      TEST_EQ("1", run("(remainder 10.0 3)"));
      TEST_EQ("-1", run("(remainder -10.0 3)"));
      TEST_EQ("1", run("(remainder 10.0 3.0)"));
      TEST_EQ("-1", run("(remainder -10.0 3.0)"));
      TEST_EQ("1", run("(remainder 10 3.0)"));
      TEST_EQ("-1", run("(remainder -10 3.0)"));


      TEST_EQ("#t", run("(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("#t", run("(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("-4", run("(let ([a 1324] [b -324.0]) (quotient a b ))"));
      TEST_EQ("28", run("(let ([a 1324] [b -324.0]) (remainder a b ))"));
      TEST_EQ("1324", run("(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))"));

      TEST_EQ("1", run("(modulo 10 3)"));
      TEST_EQ("2", run("(modulo -10 3)"));
      TEST_EQ("1", run("(modulo 10.0 3)"));
      TEST_EQ("-1", run("(modulo -10.0 -3)"));
      TEST_EQ("1", run("(modulo 10.0 3.0)"));
      TEST_EQ("2", run("(modulo -10.0 3.0)"));
      TEST_EQ("-2", run("(modulo 10 -3.0)"));
      TEST_EQ("2", run("(modulo -10 3.0)"));

      TEST_EQ("3", run("(abs 3)"));
      TEST_EQ("3.2", run("(abs 3.2)"));
      TEST_EQ("3", run("(abs -3)"));
      TEST_EQ("3.2", run("(abs -3.2)"));
      TEST_EQ("0", run("(abs 0)"));
      TEST_EQ("0", run("(abs 0.0)"));

      TEST_EQ("3", run("(flonum->fixnum 3.143)"));
      TEST_EQ("-3", run("(flonum->fixnum -3.143)"));

      TEST_EQ("3", run("(fixnum->flonum 3)"));
      TEST_EQ("#t", run("(flonum? (fixnum->flonum 3))"));

      TEST_EQ("1", run_optimized("(max 1)"));
      TEST_EQ("2", run_optimized("(min 2)"));
      TEST_EQ("1.5", run_optimized("(max 1.5)"));
      TEST_EQ("2.2", run_optimized("(min 2.2)"));
      TEST_EQ("2", run_optimized("(max 1.0 2.0)"));
      TEST_EQ("7.2", run_optimized("(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("2", run_optimized("(max 1 2.0)"));
      TEST_EQ("2", run_optimized("(max 1.0 2)"));
      TEST_EQ("2", run_optimized("(max 1 2)"));
      TEST_EQ("7", run_optimized("(max 1 2 7 -3 -11 6 3)"));

      TEST_EQ("1", run_optimized("(min 1.0 2.0)"));
      TEST_EQ("-11", run_optimized("(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("1", run_optimized("(min 1 2.0)"));
      TEST_EQ("1", run_optimized("(min 1.0 2)"));
      TEST_EQ("1", run_optimized("(min 1 2)"));
      TEST_EQ("-11", run_optimized("(min 1 2 7 -3 -11 6 3)"));
      TEST_EQ("1024", run_optimized("(arithmetic-shift 1 10)"));
      TEST_EQ("31", run_optimized("(arithmetic-shift 255 -3)"));

      TEST_EQ("3", run_optimized("(quotient 10 3)"));
      TEST_EQ("-3", run_optimized("(quotient -10 3)"));
      TEST_EQ("3", run_optimized("(quotient 10.0 3)"));
      TEST_EQ("-3", run_optimized("(quotient -10.0 3)"));
      TEST_EQ("3", run_optimized("(quotient 10.0 3.0)"));
      TEST_EQ("-3", run_optimized("(quotient -10.0 3.0)"));
      TEST_EQ("3", run_optimized("(quotient 10 3.0)"));
      TEST_EQ("-3", run_optimized("(quotient -10 3.0)"));

      TEST_EQ("1", run_optimized("(remainder 10 3)"));
      TEST_EQ("-1", run_optimized("(remainder -10 3)"));
      TEST_EQ("1", run_optimized("(remainder 10.0 3)"));
      TEST_EQ("-1", run_optimized("(remainder -10.0 3)"));
      TEST_EQ("1", run_optimized("(remainder 10.0 3.0)"));
      TEST_EQ("-1", run_optimized("(remainder -10.0 3.0)"));
      TEST_EQ("1", run_optimized("(remainder 10 3.0)"));
      TEST_EQ("-1", run_optimized("(remainder -10 3.0)"));

      TEST_EQ("#t", run_optimized("(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("#t", run_optimized("(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("-4", run_optimized("(let ([a 1324] [b -324.0]) (quotient a b ))"));
      TEST_EQ("28", run_optimized("(let ([a 1324] [b -324.0]) (remainder a b ))"));
      TEST_EQ("1324", run_optimized("(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))"));

      TEST_EQ("1", run_optimized("(modulo 10 3)"));
      TEST_EQ("2", run_optimized("(modulo -10 3)"));
      TEST_EQ("1", run_optimized("(modulo 10.0 3)"));
      TEST_EQ("-1", run_optimized("(modulo -10.0 -3)"));
      TEST_EQ("1", run_optimized("(modulo 10.0 3.0)"));
      TEST_EQ("2", run_optimized("(modulo -10.0 3.0)"));
      TEST_EQ("-2", run_optimized("(modulo 10 -3.0)"));
      TEST_EQ("2", run_optimized("(modulo -10 3.0)"));

      TEST_EQ("3", run_optimized("(abs 3)"));
      TEST_EQ("3.2", run_optimized("(abs 3.2)"));
      TEST_EQ("3", run_optimized("(abs -3)"));
      TEST_EQ("3.2", run_optimized("(abs -3.2)"));
      TEST_EQ("0", run_optimized("(abs 0)"));
      TEST_EQ("0", run_optimized("(abs 0.0)"));

      TEST_EQ("3", run("(inexact->exact 3.14)"));
      TEST_EQ("3", run("(inexact->exact 3)"));

      TEST_EQ("3.14", run("(exact->inexact 3.14)"));
      TEST_EQ("3", run("(exact->inexact 3)"));
      TEST_EQ("#t", run("(flonum? (exact->inexact 3))"));
      TEST_EQ("#t", run("(inexact? (exact->inexact 3))"));

      TEST_EQ("#t", run("(finite? 3.14)"));
      TEST_EQ("#t", run("(finite? 2)"));
      TEST_EQ("#f", run("(finite? (/ 1.0 0.0))"));
      TEST_EQ("#f", run("(finite? (/ 0.0 0.0))"));

      TEST_EQ("#f", run("(nan? 3.14)"));
      TEST_EQ("#f", run("(nan? 2)"));
      TEST_EQ("#f", run("(nan? (/ 1.0 0.0))"));
      TEST_EQ("#t", run("(nan? (/ 0.0 0.0))"));

      TEST_EQ("#f", run("(inf? 3.14)"));
      TEST_EQ("#f", run("(inf? 2)"));
      TEST_EQ("#t", run("(inf? (/ 1.0 0.0))"));
      TEST_EQ("#f", run("(inf? (/ 0.0 0.0))"));

#ifdef _WIN32
      TEST_EQ("-nan(ind)", run("(/ 0.0 0.0)"));
#elif defined(unix)
      TEST_EQ("-nan", run("(/ 0.0 0.0)"));
#else
      TEST_EQ("nan", run("(/ 0.0 0.0)"));
#endif

      TEST_EQ("#t", run("(integer? 3)"));
      TEST_EQ("#f", run("(integer? 3.2)"));
      TEST_EQ("#t", run("(integer? 3.0)"));

      TEST_EQ("3", run("(ceiling 3)"));
      TEST_EQ("3", run("(ceiling 3.0)"));
      TEST_EQ("4", run("(ceiling 3.0000000001)"));
      TEST_EQ("3", run("(ceiling 2.9)"));
      TEST_EQ("-3", run("(ceiling -3)"));
      TEST_EQ("-3", run("(ceiling -3.1)"));
      TEST_EQ("-2", run("(ceiling -2.9)"));
      TEST_EQ("-2", run("(ceiling -2.5)"));
      TEST_EQ("-2", run("(ceiling -2.1)"));

      TEST_EQ("3", run("(floor 3)"));
      TEST_EQ("3", run("(floor 3.0)"));
      TEST_EQ("3", run("(floor 3.0000000001)"));
      TEST_EQ("2", run("(floor 2.9)"));
      TEST_EQ("-3", run("(floor -3)"));
      TEST_EQ("-4", run("(floor -3.1)"));
      TEST_EQ("-3", run("(floor -2.9)"));
      TEST_EQ("-3", run("(floor -2.5)"));
      TEST_EQ("-3", run("(floor -2.1)"));
      }